

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_xlib.h
# Opt level: O0

void nk_xsurf_stroke_line
               (XSurface *surf,short x0,short y0,short x1,short y1,uint line_thickness,nk_color col)

{
  unsigned_long uVar1;
  short in_CX;
  short in_DX;
  short in_SI;
  undefined8 *in_RDI;
  short in_R8W;
  undefined4 in_R9D;
  unsigned_long c;
  
  uVar1 = nk_color_from_byte((nk_byte *)&c);
  XSetForeground(in_RDI[1],*in_RDI,uVar1);
  XSetLineAttributes(in_RDI[1],*in_RDI,in_R9D,0,1);
  XDrawLine(in_RDI[1],in_RDI[4],*in_RDI,(int)in_SI,(int)in_DX,(int)in_CX,(int)in_R8W);
  XSetLineAttributes(in_RDI[1],*in_RDI,1,0);
  return;
}

Assistant:

static void
nk_xsurf_stroke_line(XSurface *surf, short x0, short y0, short x1,
    short y1, unsigned int line_thickness, struct nk_color col)
{
    unsigned long c = nk_color_from_byte(&col.r);
    XSetForeground(surf->dpy, surf->gc, c);
    XSetLineAttributes(surf->dpy, surf->gc, line_thickness, LineSolid, CapButt, JoinMiter);
    XDrawLine(surf->dpy, surf->drawable, surf->gc, (int)x0, (int)y0, (int)x1, (int)y1);
    XSetLineAttributes(surf->dpy, surf->gc, 1, LineSolid, CapButt, JoinMiter);
}